

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeginningWithTests.cpp
# Opt level: O3

void __thiscall
IsStringBeginningWithTests::~IsStringBeginningWithTests(IsStringBeginningWithTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("string BeginningWith desired string is true", [&]() {
			AssertThat(ut11::Is::String::BeginningWith("Hell")("HelloAvsdaasdagf"), ut11::Is::True);
		});

		Then("AssertThat using BeginningWith works as expected", [&]() {
			AssertThat("Pianos and Pies", ut11::Is::String::BeginningWith("Pianos"));
		});

		Then("string not BeginningWith desired string is false", [&]() {
			AssertThat(ut11::Is::String::BeginningWith("Hell")("AvsdaHelloasdagf"), ut11::Is::False);
		});

		Then("string smaller than the desired string is false", [&]() {
			AssertThat(ut11::Is::String::BeginningWith("Hell")("He"), ut11::Is::False);
		});

		Then("Is::String::BeginningWith is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::String::BeginningWith("world")) >::value, ut11::Is::True);
		});

		Then("Is::String::BeginningWith has an error message", []() {
			AssertThat(ut11::Is::String::BeginningWith("world").GetErrorMessage("piano"), ut11::Is::Not::EqualTo(""));
		});
	}